

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O2

void __thiscall Character::DropAll(Character *this,Character *killer)

{
  uint id;
  World *pWVar1;
  bool bVar2;
  EIF_Data *pEVar3;
  mapped_type *pmVar4;
  iterator __position;
  int num;
  uint uVar5;
  long lVar6;
  double dVar7;
  allocator<char> local_89;
  double local_88;
  shared_ptr<Map_Item> map_item;
  double local_70;
  PacketBuilder builder;
  
  if ((this->nointeract & 2) == 0) {
    __position._M_node =
         (this->inventory).super__List_base<Character_Item,_std::allocator<Character_Item>_>._M_impl
         ._M_node.super__List_node_base._M_next;
    while (__position._M_node != (_List_node_base *)&this->inventory) {
      pEVar3 = EIF::Get(this->world->eif,(int)*(short *)&__position._M_node[1]._M_next);
      if (pEVar3->special == Lore) {
        __position._M_node = (__position._M_node)->_M_next;
      }
      else {
        Map::AddItem((Map *)&map_item,(short)this->player->character->map,
                     (int)*(short *)&__position._M_node[1]._M_next,
                     (uchar)*(undefined4 *)((long)&__position._M_node[1]._M_next + 4),this->x,
                     (Character *)(ulong)this->y);
        if (map_item.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          if (killer == (Character *)0x0) {
            (map_item.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->owner =
                 this->player->id;
            local_88 = Timer::GetTime();
            pWVar1 = this->world;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&builder,"ProtectDeathDrop",&local_89);
            pmVar4 = std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)&pWVar1->config,(key_type *)&builder);
            dVar7 = util::variant::GetFloat(pmVar4);
          }
          else {
            (map_item.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->owner =
                 killer->player->id;
            local_88 = Timer::GetTime();
            pWVar1 = this->world;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&builder,"ProtectPKDrop",&local_89);
            pmVar4 = std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)&pWVar1->config,(key_type *)&builder);
            dVar7 = util::variant::GetFloat(pmVar4);
          }
          (map_item.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->unprotecttime
               = local_88 + dVar7;
          std::__cxx11::string::~string((string *)&builder);
          PacketBuilder::PacketBuilder(&builder,PACKET_ITEM,PACKET_DROP,0xf);
          PacketBuilder::AddShort(&builder,(int)*(short *)&__position._M_node[1]._M_next);
          PacketBuilder::AddThree(&builder,*(int *)((long)&__position._M_node[1]._M_next + 4));
          PacketBuilder::AddInt(&builder,0);
          PacketBuilder::AddShort
                    (&builder,(int)(map_item.
                                    super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                                   ->uid);
          PacketBuilder::AddChar(&builder,(uint)this->x);
          PacketBuilder::AddChar(&builder,(uint)this->y);
          PacketBuilder::AddChar(&builder,this->weight);
          PacketBuilder::AddChar(&builder,this->maxweight);
          Send(this,&builder);
          PacketBuilder::~PacketBuilder(&builder);
        }
        __position = std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::erase
                               (&this->inventory,__position._M_node);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&map_item.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
    }
    CalculateStats(this,true);
    uVar5 = 0xfffffff6;
    for (lVar6 = 0x2e8; lVar6 != 0x324; lVar6 = lVar6 + 4) {
      id = *(uint *)((long)&(this->super_Command_Source)._vptr_Command_Source + lVar6);
      if (id != 0) {
        pEVar3 = EIF::Get(this->world->eif,id);
        if (pEVar3->special != Lore) {
          pEVar3 = EIF::Get(this->world->eif,id);
          if (pEVar3->special != Cursed) {
            local_88 = (double)CONCAT44(local_88._4_4_,(int)(short)id);
            Map::AddItem((Map *)&map_item,(short)this->player->character->map,(int)(short)id,'\x01',
                         this->x,(Character *)(ulong)this->y);
            if (map_item.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              if (killer == (Character *)0x0) {
                (map_item.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->owner =
                     this->player->id;
                local_70 = Timer::GetTime();
                pWVar1 = this->world;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&builder,"ProtectDeathDrop",&local_89);
                pmVar4 = std::__detail::
                         _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                       *)&pWVar1->config,(key_type *)&builder);
                dVar7 = util::variant::GetFloat(pmVar4);
              }
              else {
                (map_item.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->owner =
                     killer->player->id;
                local_70 = Timer::GetTime();
                pWVar1 = this->world;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&builder,"ProtectPKDrop",&local_89);
                pmVar4 = std::__detail::
                         _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                       *)&pWVar1->config,(key_type *)&builder);
                dVar7 = util::variant::GetFloat(pmVar4);
              }
              (map_item.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              unprotecttime = local_70 + dVar7;
              std::__cxx11::string::~string((string *)&builder);
              num = 0;
              if (uVar5 < 5) {
                num = *(int *)(&DAT_0018107c + (ulong)uVar5 * 4);
              }
              bVar2 = Unequip(this->player->character,SUB82(local_88,0),(uchar)num);
              if (bVar2) {
                PacketBuilder::PacketBuilder(&builder,PACKET_PAPERDOLL,PACKET_REMOVE,0x2b);
                PacketBuilder::AddShort(&builder,this->player->id);
                PacketBuilder::AddChar(&builder,1);
                PacketBuilder::AddChar(&builder,0);
                AddPaperdollData(this,&builder,"BAHWS");
                PacketBuilder::AddShort(&builder,id);
                PacketBuilder::AddChar(&builder,num);
                PacketBuilder::AddShort(&builder,this->maxhp);
                PacketBuilder::AddShort(&builder,this->maxtp);
                PacketBuilder::AddShort(&builder,*this->display_str);
                PacketBuilder::AddShort(&builder,*this->display_intl);
                PacketBuilder::AddShort(&builder,*this->display_wis);
                PacketBuilder::AddShort(&builder,*this->display_agi);
                PacketBuilder::AddShort(&builder,*this->display_con);
                PacketBuilder::AddShort(&builder,*this->display_cha);
                PacketBuilder::AddShort(&builder,this->mindam);
                PacketBuilder::AddShort(&builder,this->maxdam);
                PacketBuilder::AddShort(&builder,this->accuracy);
                PacketBuilder::AddShort(&builder,this->evade);
                PacketBuilder::AddShort(&builder,this->armor);
                Send(this,&builder);
                PacketBuilder::~PacketBuilder(&builder);
              }
              DelItem(this->player->character,SUB82(local_88,0),1);
              PacketBuilder::PacketBuilder(&builder,PACKET_ITEM,PACKET_DROP,0xf);
              PacketBuilder::AddShort(&builder,id);
              PacketBuilder::AddThree(&builder,1);
              PacketBuilder::AddInt(&builder,0);
              PacketBuilder::AddShort
                        (&builder,(int)(map_item.
                                        super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_ptr)->uid);
              PacketBuilder::AddChar(&builder,(uint)this->x);
              PacketBuilder::AddChar(&builder,(uint)this->y);
              PacketBuilder::AddChar(&builder,this->weight);
              PacketBuilder::AddChar(&builder,this->maxweight);
              Send(this,&builder);
              PacketBuilder::~PacketBuilder(&builder);
            }
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&map_item.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
        }
      }
      uVar5 = uVar5 + 1;
    }
  }
  return;
}

Assistant:

void Character::DropAll(Character *killer)
{
	if (!CanInteractItems()) return;

	std::list<Character_Item>::iterator it = this->inventory.begin();

	while (it != this->inventory.end())
	{
		if (this->world->eif->Get(it->id).special == EIF::Lore)
		{
			++it;
			continue;
		}

		std::shared_ptr<Map_Item> map_item = this->player->character->map->AddItem(it->id, it->amount, this->x, this->y, 0);

		if (map_item)
		{
			if (killer)
			{
				map_item->owner = killer->PlayerID();
				map_item->unprotecttime = Timer::GetTime() + static_cast<double>(this->world->config["ProtectPKDrop"]);
			}
			else
			{
				map_item->owner = this->PlayerID();
				map_item->unprotecttime = Timer::GetTime() + static_cast<double>(this->world->config["ProtectDeathDrop"]);
			}

			PacketBuilder builder(PACKET_ITEM, PACKET_DROP, 15);
			builder.AddShort(it->id);
			builder.AddThree(it->amount);
			builder.AddInt(0);
			builder.AddShort(map_item->uid);
			builder.AddChar(this->x);
			builder.AddChar(this->y);
			builder.AddChar(this->weight);
			builder.AddChar(this->maxweight);
			this->Send(builder);
		}

		it = this->inventory.erase(it);
	}

	this->CalculateStats();

	int i = 0;
	UTIL_FOREACH(this->paperdoll, id)
	{
		if (id == 0 || this->world->eif->Get(id).special == EIF::Lore || this->world->eif->Get(id).special == EIF::Cursed)
		{
			++i;
			continue;
		}

		std::shared_ptr<Map_Item> map_item = this->player->character->map->AddItem(id, 1, this->x, this->y, 0);

		if (map_item)
		{
			if (killer)
			{
				map_item->owner = killer->PlayerID();
				map_item->unprotecttime = Timer::GetTime() + static_cast<double>(this->world->config["ProtectPKDrop"]);
			}
			else
			{
				map_item->owner = this->PlayerID();
				map_item->unprotecttime = Timer::GetTime() + static_cast<double>(this->world->config["ProtectDeathDrop"]);
			}

			int subloc = 0;

			if (i == Ring2 || i == Armlet2 || i == Bracer2)
			{
				subloc = 1;
			}

			if (this->player->character->Unequip(id, subloc))
			{
				PacketBuilder builder(PACKET_PAPERDOLL, PACKET_REMOVE, 43);
				builder.AddShort(this->PlayerID());
				builder.AddChar(SLOT_CLOTHES);
				builder.AddChar(0); // sound
				this->AddPaperdollData(builder, "BAHWS");
				builder.AddShort(id);
				builder.AddChar(subloc);
				builder.AddShort(this->maxhp);
				builder.AddShort(this->maxtp);
				builder.AddShort(this->display_str);
				builder.AddShort(this->display_intl);
				builder.AddShort(this->display_wis);
				builder.AddShort(this->display_agi);
				builder.AddShort(this->display_con);
				builder.AddShort(this->display_cha);
				builder.AddShort(this->mindam);
				builder.AddShort(this->maxdam);
				builder.AddShort(this->accuracy);
				builder.AddShort(this->evade);
				builder.AddShort(this->armor);
				this->Send(builder);
			}

			this->player->character->DelItem(id, 1);

			PacketBuilder builder(PACKET_ITEM, PACKET_DROP, 15);
			builder.AddShort(id);
			builder.AddThree(1);
			builder.AddInt(0);
			builder.AddShort(map_item->uid);
			builder.AddChar(this->x);
			builder.AddChar(this->y);
			builder.AddChar(this->weight);
			builder.AddChar(this->maxweight);
			this->Send(builder);
		}

		++i;
	}
}